

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall ON_Extrusion::GetSpanVector(ON_Extrusion *this,int dir,double *span_vector)

{
  ON_Curve *pOVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  if (span_vector != (double *)0x0) {
    uVar2 = this->m_bTransposed ^ 1;
    if (uVar2 == dir) {
      dVar4 = ON_Interval::operator[](&this->m_path_domain,0);
      *span_vector = dVar4;
      dVar4 = ON_Interval::operator[](&this->m_path_domain,1);
      span_vector[1] = dVar4;
      return true;
    }
    if (((uVar2 ^ dir) == 1) && (pOVar1 = this->m_profile, pOVar1 != (ON_Curve *)0x0)) {
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])
                        (pOVar1,span_vector);
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

bool ON_Extrusion::GetSpanVector( // span "knots" 
      int dir, // 0 gets first parameter's domain, 1 gets second parameter's domain
      double* span_vector // array of length SpanCount() + 1 
      ) const  // 
{
  if ( span_vector )
  {
    const int path_dir = PathParameter();
    if ( path_dir == dir )
    {
      span_vector[0] = m_path_domain[0];
      span_vector[1] = m_path_domain[1];
      return true;
    }
    if ( 1-path_dir == dir && m_profile )
    {
      return m_profile->GetSpanVector(span_vector);
    }
  }
  return false;
}